

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Ptr_t * Abc_AigDfs(Abc_Ntk_t *pNtk,int fCollectAll,int fCollectCos)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pNode_00;
  int local_2c;
  int i;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  int fCollectCos_local;
  int fCollectAll_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                  ,0x4b3,"Vec_Ptr_t *Abc_AigDfs(Abc_Ntk_t *, int, int)");
  }
  Abc_NtkIncrementTravId(pNtk);
  vNodes_00 = Vec_PtrAlloc(100);
  for (local_2c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkCo(pNtk,local_2c);
    pNode_00 = Abc_ObjFanin0(pAVar2);
    Abc_AigDfs_rec(pNode_00,vNodes_00);
    Abc_NodeSetTravIdCurrent(pAVar2);
    if (fCollectCos != 0) {
      Vec_PtrPush(vNodes_00,pAVar2);
    }
  }
  if (fCollectAll != 0) {
    for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar1; local_2c = local_2c + 1)
    {
      pAVar2 = Abc_NtkObj(pNtk,local_2c);
      if (((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) &&
         (iVar1 = Abc_NodeIsTravIdCurrent(pAVar2), iVar1 == 0)) {
        Abc_AigDfs_rec(pAVar2,vNodes_00);
      }
    }
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Abc_AigDfs( Abc_Ntk_t * pNtk, int fCollectAll, int fCollectCos )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        Abc_AigDfs_rec( Abc_ObjFanin0(pNode), vNodes );
        Abc_NodeSetTravIdCurrent( pNode );
        if ( fCollectCos )
            Vec_PtrPush( vNodes, pNode );
    }
    // collect dangling nodes if asked to
    if ( fCollectAll )
    {
        Abc_NtkForEachNode( pNtk, pNode, i )
            if ( !Abc_NodeIsTravIdCurrent(pNode) )
                Abc_AigDfs_rec( pNode, vNodes );
    }
    return vNodes;
}